

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O2

cmd_params * parse_cmd_params(cmd_params *__return_storage_ptr__,int argc,char **argv)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  _Bit_iterator __last_01;
  _Bit_iterator __last_02;
  _Bit_iterator __last_03;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_03;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_04;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first_05;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_06;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_07;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __a;
  _Bvector_impl *p_Var11;
  undefined8 uVar12;
  output_formats oVar13;
  pointer pbVar14;
  pointer pbVar15;
  pointer pbVar16;
  undefined8 uVar17;
  bool bVar18;
  char cVar19;
  bool bVar20;
  int iVar21;
  ggml_sched_priority gVar22;
  long lVar23;
  ulong uVar24;
  size_type __n;
  ulong uVar25;
  ggml_numa_strategy gVar26;
  char separator;
  char delim;
  char delim_00;
  char separator_00;
  char delim_01;
  char delim_02;
  char separator_01;
  char separator_02;
  char delim_03;
  char separator_03;
  char delim_04;
  char delim_05;
  char delim_06;
  char separator_04;
  char delim_07;
  char delim_08;
  char delim_09;
  char delim_10;
  char delim_11;
  char separator_05;
  char *pcVar27;
  output_formats *format;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string *psVar28;
  int iVar29;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  float fVar30;
  _Bit_iterator __first_08;
  _Bit_iterator __first_09;
  _Bit_iterator __first_10;
  _Bit_iterator __first_11;
  _Bit_iterator __first_12;
  const_iterator __position;
  const_iterator __position_00;
  const_iterator __position_01;
  const_iterator __position_02;
  const_iterator __position_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p;
  long local_3a0;
  allocator_type local_389;
  regex regex;
  sregex_token_iterator it;
  pointer local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_arg;
  vector<float,_std::allocator<float>_> tensor_split;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  regex_type *local_1b8;
  match_flag_type mStack_1b0;
  undefined4 uStack_1ac;
  regex_type *local_1a8;
  match_flag_type mStack_1a0;
  undefined4 uStack_19c;
  regex_type *local_198;
  match_flag_type mStack_190;
  undefined4 uStack_18c;
  regex_type *local_188;
  match_flag_type mStack_180;
  undefined4 uStack_17c;
  regex_type *local_178;
  match_flag_type mStack_170;
  undefined4 uStack_16c;
  string arg_prefix;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_148;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_b8;
  
  cmd_params::cmd_params(__return_storage_ptr__);
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg_prefix,"--",(allocator<char> *)&it);
  __return_storage_ptr__->verbose = cmd_params_defaults.verbose;
  oVar13 = cmd_params_defaults.output_format_stderr;
  __return_storage_ptr__->output_format = cmd_params_defaults.output_format;
  uVar12 = cmd_params_defaults._592_8_;
  __return_storage_ptr__->output_format_stderr = oVar13;
  iVar29 = cmd_params_defaults.reps;
  __return_storage_ptr__->numa = cmd_params_defaults.numa;
  uVar17 = cmd_params_defaults._592_8_;
  __return_storage_ptr__->reps = iVar29;
  cmd_params_defaults.prio = (ggml_sched_priority)uVar12;
  cmd_params_defaults.delay = SUB84(uVar12,4);
  iVar29 = cmd_params_defaults.delay;
  __return_storage_ptr__->prio = cmd_params_defaults.prio;
  cmd_params_defaults._592_8_ = uVar17;
  __return_storage_ptr__->delay = iVar29;
  __return_storage_ptr__->progress = cmd_params_defaults.progress;
  iVar29 = 1;
  bVar20 = false;
LAB_00122a1d:
  if (argc <= iVar29) {
LAB_00123d3c:
    if (!bVar20) {
      if ((__return_storage_ptr__->model).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->model).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&__return_storage_ptr__->model,&cmd_params_defaults.model);
      }
      if ((__return_storage_ptr__->n_prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->n_prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (&__return_storage_ptr__->n_prompt,&cmd_params_defaults.n_prompt);
      }
      if ((__return_storage_ptr__->n_gen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->n_gen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (&__return_storage_ptr__->n_gen,&cmd_params_defaults.n_gen);
      }
      if ((__return_storage_ptr__->n_pg).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->n_pg).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                  (&__return_storage_ptr__->n_pg,&cmd_params_defaults.n_pg);
      }
      if ((__return_storage_ptr__->n_batch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->n_batch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (&__return_storage_ptr__->n_batch,&cmd_params_defaults.n_batch);
      }
      if ((__return_storage_ptr__->n_ubatch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->n_ubatch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (&__return_storage_ptr__->n_ubatch,&cmd_params_defaults.n_ubatch);
      }
      if ((__return_storage_ptr__->type_k).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->type_k).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<ggml_type,_std::allocator<ggml_type>_>::operator=
                  (&__return_storage_ptr__->type_k,&cmd_params_defaults.type_k);
      }
      if ((__return_storage_ptr__->type_v).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->type_v).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<ggml_type,_std::allocator<ggml_type>_>::operator=
                  (&__return_storage_ptr__->type_v,&cmd_params_defaults.type_v);
      }
      if ((__return_storage_ptr__->n_gpu_layers).super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->n_gpu_layers).super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (&__return_storage_ptr__->n_gpu_layers,&cmd_params_defaults.n_gpu_layers);
      }
      if ((__return_storage_ptr__->rpc_servers).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->rpc_servers).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&__return_storage_ptr__->rpc_servers,&cmd_params_defaults.rpc_servers);
      }
      if ((__return_storage_ptr__->split_mode).
          super__Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->split_mode).
          super__Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>::operator=
                  (&__return_storage_ptr__->split_mode,&cmd_params_defaults.split_mode);
      }
      if ((__return_storage_ptr__->main_gpu).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->main_gpu).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (&__return_storage_ptr__->main_gpu,&cmd_params_defaults.main_gpu);
      }
      if (((__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
           (__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
         ((__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl
          .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (&__return_storage_ptr__->no_kv_offload,&cmd_params_defaults.no_kv_offload);
      }
      if (((__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
           (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
         ((__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (&__return_storage_ptr__->flash_attn,&cmd_params_defaults.flash_attn);
      }
      if ((__return_storage_ptr__->tensor_split).
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->tensor_split).
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator=(&__return_storage_ptr__->tensor_split,&cmd_params_defaults.tensor_split);
      }
      if (((__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
           (__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
         ((__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (&__return_storage_ptr__->use_mmap,&cmd_params_defaults.use_mmap);
      }
      if (((__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
           (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
         ((__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (&__return_storage_ptr__->embeddings,&cmd_params_defaults.embeddings);
      }
      if ((__return_storage_ptr__->n_threads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->n_threads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (&__return_storage_ptr__->n_threads,&cmd_params_defaults.n_threads);
      }
      if ((__return_storage_ptr__->cpu_mask).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->cpu_mask).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&__return_storage_ptr__->cpu_mask,&cmd_params_defaults.cpu_mask);
      }
      if (((__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
           (__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
         ((__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (&__return_storage_ptr__->cpu_strict,&cmd_params_defaults.cpu_strict);
      }
      if ((__return_storage_ptr__->poll).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->poll).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (&__return_storage_ptr__->poll,&cmd_params_defaults.poll);
      }
      std::__cxx11::string::~string((string *)&arg_prefix);
      std::__cxx11::string::~string((string *)&arg);
      return __return_storage_ptr__;
    }
LAB_0012406f:
    pcVar27 = "error: invalid parameter for argument: %s\n";
    fprintf(_stderr,"error: invalid parameter for argument: %s\n",arg._M_dataplus._M_p);
    print_usage((int)argv,(char **)pcVar27);
    exit(1);
  }
  std::__cxx11::string::assign((char *)&arg);
  iVar21 = std::__cxx11::string::compare((ulong)&arg,0,(string *)arg_prefix._M_string_length);
  if (iVar21 == 0) {
    it._M_position._M_begin._M_current._0_1_ = 0x5f;
    p.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x2d;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )arg._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(arg._M_dataplus._M_p + arg._M_string_length),(char *)&it,(char *)&p);
  }
  pcVar27 = "-h";
  bVar18 = std::operator==(&arg,"-h");
  if (bVar18) {
LAB_00123d0a:
    print_usage((int)argv,(char **)pcVar27);
    exit(0);
  }
  pcVar27 = "--help";
  bVar18 = std::operator==(&arg,"--help");
  if (bVar18) goto LAB_00123d0a;
  bVar18 = std::operator==(&arg,"-m");
  if ((bVar18) || (bVar18 = std::operator==(&arg,"--model"), bVar18)) {
    if (iVar29 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
      string_split<std::__cxx11::string>(&p,(string *)&it,separator);
      std::__cxx11::string::~string((string *)&it);
      __first._M_current._1_7_ =
           p.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start._1_7_;
      __first._M_current._0_1_ =
           p.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start._0_1_;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->model).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,__first,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )p.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      goto LAB_00122b21;
    }
    goto LAB_0012406f;
  }
  bVar18 = std::operator==(&arg,"-p");
  if ((bVar18) || (bVar18 = std::operator==(&arg,"--n-prompt"), bVar18)) {
    if (argc <= iVar29 + 1) goto LAB_0012406f;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
    string_split<int>((vector<int,_std::allocator<int>_> *)&p,(string *)&it,delim);
    std::__cxx11::string::~string((string *)&it);
    __first_00._M_current._1_7_ =
         p.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._1_7_;
    __first_00._M_current._0_1_ =
         p.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._0_1_;
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_prompt,
               (const_iterator)
               (__return_storage_ptr__->n_prompt).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish,__first_00,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               p.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    bVar18 = std::operator==(&arg,"-n");
    if ((bVar18) || (bVar18 = std::operator==(&arg,"--n-gen"), bVar18)) {
      if (iVar29 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<int>((vector<int,_std::allocator<int>_> *)&p,(string *)&it,delim_00);
        std::__cxx11::string::~string((string *)&it);
        __first_01._M_current._1_7_ =
             p.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._1_7_;
        __first_01._M_current._0_1_ =
             p.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_;
        std::vector<int,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_gen,
                   (const_iterator)
                   (__return_storage_ptr__->n_gen).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,__first_01,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   p.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        goto LAB_00122ba6;
      }
      goto LAB_0012406f;
    }
    bVar18 = std::operator==(&arg,"-pg");
    if (bVar18) {
      iVar29 = iVar29 + 1;
      if (argc <= iVar29) goto LAB_0012406f;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,argv[iVar29],(allocator<char> *)&regex);
      string_split<std::__cxx11::string>(&p,(string *)&it,separator_00);
      std::__cxx11::string::~string((string *)&it);
      lVar23 = (long)p.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)CONCAT71(p.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              p.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_1_);
      bVar18 = true;
      if (lVar23 == 0x40) {
        iVar21 = std::__cxx11::stoi((string *)
                                    CONCAT71(p.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             p.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                    (size_t *)0x0,10);
        it._M_position._M_begin._M_current._4_4_ =
             std::__cxx11::stoi((string *)
                                (CONCAT71(p.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                          p.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_1_) + 0x20),
                                (size_t *)0x0,10);
        it._M_position._M_begin._M_current._0_4_ = iVar21;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   &__return_storage_ptr__->n_pg,(pair<int,_int> *)&it);
        bVar18 = bVar20;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&p);
      bVar20 = bVar18;
      if (lVar23 == 0x40) goto LAB_00122bb0;
      goto LAB_00123d3c;
    }
    bVar18 = std::operator==(&arg,"-b");
    if ((bVar18) || (bVar18 = std::operator==(&arg,"--batch-size"), bVar18)) {
      if (iVar29 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<int>((vector<int,_std::allocator<int>_> *)&p,(string *)&it,delim_01);
        std::__cxx11::string::~string((string *)&it);
        __first_02._M_current._1_7_ =
             p.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._1_7_;
        __first_02._M_current._0_1_ =
             p.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_;
        std::vector<int,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_batch,
                   (const_iterator)
                   (__return_storage_ptr__->n_batch).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,__first_02,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   p.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        goto LAB_00122ba6;
      }
      goto LAB_0012406f;
    }
    bVar18 = std::operator==(&arg,"-ub");
    if ((bVar18) || (bVar18 = std::operator==(&arg,"--ubatch-size"), bVar18)) {
      if (iVar29 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<int>((vector<int,_std::allocator<int>_> *)&p,(string *)&it,delim_02);
        std::__cxx11::string::~string((string *)&it);
        __first_03._M_current._1_7_ =
             p.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._1_7_;
        __first_03._M_current._0_1_ =
             p.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_;
        std::vector<int,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_ubatch,
                   (const_iterator)
                   (__return_storage_ptr__->n_ubatch).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,__first_03,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   p.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        goto LAB_00122ba6;
      }
      goto LAB_0012406f;
    }
    bVar18 = std::operator==(&arg,"-ctk");
    if ((bVar18) || (bVar18 = std::operator==(&arg,"--cache-type-k"), bVar18)) {
      if (argc <= iVar29 + 1) goto LAB_0012406f;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
      string_split<std::__cxx11::string>(&p,(string *)&it,separator_01);
      std::__cxx11::string::~string((string *)&it);
      pbVar14 = p.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      it._M_position._M_pregex = (regex_type *)0x0;
      it._M_position._M_begin._M_current = (char *)0x0;
      it._M_position._M_end._M_current = (char *)0x0;
      for (psVar28 = (string *)
                     CONCAT71(p.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              p.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_1_); psVar28 != pbVar14;
          psVar28 = psVar28 + 1) {
        regex._M_flags = ggml_type_from_name(psVar28);
        if (regex._M_flags == 0x27) goto LAB_00123cf1;
        std::vector<ggml_type,_std::allocator<ggml_type>_>::push_back
                  ((vector<ggml_type,_std::allocator<ggml_type>_> *)&it,&regex._M_flags);
      }
      if (!bVar20) {
        std::vector<ggml_type,std::allocator<ggml_type>>::
        insert<__gnu_cxx::__normal_iterator<ggml_type*,std::vector<ggml_type,std::allocator<ggml_type>>>,void>
                  ((vector<ggml_type,std::allocator<ggml_type>> *)&__return_storage_ptr__->type_k,
                   (const_iterator)
                   (__return_storage_ptr__->type_k).
                   super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                    )it._M_position._M_begin._M_current,
                   (__normal_iterator<ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                    )it._M_position._M_end._M_current);
LAB_00122ee9:
        std::_Vector_base<ggml_type,_std::allocator<ggml_type>_>::~_Vector_base
                  ((_Vector_base<ggml_type,_std::allocator<ggml_type>_> *)&it);
LAB_00122b21:
        this = &p;
LAB_00122b26:
        iVar29 = iVar29 + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(this);
        goto LAB_00122bb0;
      }
      goto LAB_00123cf4;
    }
    bVar18 = std::operator==(&arg,"-ctv");
    if ((bVar18) || (bVar18 = std::operator==(&arg,"--cache-type-v"), bVar18)) {
      if (iVar29 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<std::__cxx11::string>(&p,(string *)&it,separator_02);
        std::__cxx11::string::~string((string *)&it);
        pbVar14 = p.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        it._M_position._M_pregex = (regex_type *)0x0;
        it._M_position._M_begin._M_current = (char *)0x0;
        it._M_position._M_end._M_current = (char *)0x0;
        for (psVar28 = (string *)
                       CONCAT71(p.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                p.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_); psVar28 != pbVar14
            ; psVar28 = psVar28 + 1) {
          regex._M_flags = ggml_type_from_name(psVar28);
          if (regex._M_flags == 0x27) goto LAB_00123cf1;
          std::vector<ggml_type,_std::allocator<ggml_type>_>::push_back
                    ((vector<ggml_type,_std::allocator<ggml_type>_> *)&it,&regex._M_flags);
        }
        if (!bVar20) {
          std::vector<ggml_type,std::allocator<ggml_type>>::
          insert<__gnu_cxx::__normal_iterator<ggml_type*,std::vector<ggml_type,std::allocator<ggml_type>>>,void>
                    ((vector<ggml_type,std::allocator<ggml_type>> *)&__return_storage_ptr__->type_v,
                     (const_iterator)
                     (__return_storage_ptr__->type_v).
                     super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (__normal_iterator<ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                      )it._M_position._M_begin._M_current,
                     (__normal_iterator<ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                      )it._M_position._M_end._M_current);
          goto LAB_00122ee9;
        }
        goto LAB_00123cf4;
      }
      goto LAB_0012406f;
    }
    bVar18 = std::operator==(&arg,"-t");
    if ((bVar18) || (bVar18 = std::operator==(&arg,"--threads"), bVar18)) {
      if (iVar29 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<int>((vector<int,_std::allocator<int>_> *)&p,(string *)&it,delim_03);
        std::__cxx11::string::~string((string *)&it);
        __first_04._M_current._1_7_ =
             p.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._1_7_;
        __first_04._M_current._0_1_ =
             p.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_;
        std::vector<int,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_threads,
                   (const_iterator)
                   (__return_storage_ptr__->n_threads).super__Vector_base<int,_std::allocator<int>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__first_04,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   p.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        goto LAB_00122ba6;
      }
      goto LAB_0012406f;
    }
    bVar18 = std::operator==(&arg,"-C");
    if ((bVar18) || (bVar18 = std::operator==(&arg,"--cpu-mask"), bVar18)) {
      if (iVar29 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<std::__cxx11::string>(&p,(string *)&it,separator_03);
        std::__cxx11::string::~string((string *)&it);
        __first_05._M_current._1_7_ =
             p.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._1_7_;
        __first_05._M_current._0_1_ =
             p.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->cpu_mask,
                   (__return_storage_ptr__->cpu_mask).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__first_05,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )p.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        goto LAB_00122b21;
      }
      goto LAB_0012406f;
    }
    bVar18 = std::operator==(&arg,"--cpu-strict");
    if (bVar18) {
      if (iVar29 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<bool>((vector<bool,_std::allocator<bool>_> *)&it,(string *)&p,delim_04);
        std::__cxx11::string::~string((string *)&p);
        p_Var11 = &(__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl;
        uVar1 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
        uVar2 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
        __position.super__Bit_iterator_base._M_offset = uVar2;
        __position.super__Bit_iterator_base._M_p = (_Bit_type *)uVar1;
        local_178 = it._M_position._M_pregex;
        mStack_170 = it._M_position._M_flags;
        __last.super__Bit_iterator_base._12_4_ = uStack_16c;
        __last.super__Bit_iterator_base._M_offset = it._M_position._M_flags;
        __last.super__Bit_iterator_base._M_p = (_Bit_type *)it._M_position._M_pregex;
        __first_08.super__Bit_iterator_base._8_8_ = 0;
        __first_08.super__Bit_iterator_base._M_p = (_Bit_type *)it._M_position._M_begin._M_current;
        __position.super__Bit_iterator_base._12_4_ = 0;
        std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                  ((vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->cpu_strict,
                   __position,__first_08,__last);
        goto LAB_00123177;
      }
      goto LAB_0012406f;
    }
    bVar18 = std::operator==(&arg,"--poll");
    if (!bVar18) {
      bVar18 = std::operator==(&arg,"-ngl");
      if ((bVar18) || (bVar18 = std::operator==(&arg,"--n-gpu-layers"), bVar18)) {
        if (iVar29 + 1 < argc) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
          string_split<int>((vector<int,_std::allocator<int>_> *)&p,(string *)&it,delim_06);
          std::__cxx11::string::~string((string *)&it);
          __first_07._M_current._1_7_ =
               p.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start._1_7_;
          __first_07._M_current._0_1_ =
               p.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start._0_1_;
          std::vector<int,std::allocator<int>>::
          insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                    ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_gpu_layers,
                     (const_iterator)
                     (__return_storage_ptr__->n_gpu_layers).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish,__first_07,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     p.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          goto LAB_00122ba6;
        }
        goto LAB_0012406f;
      }
      cVar19 = llama_supports_rpc();
      if ((cVar19 != '\0') &&
         ((bVar18 = std::operator==(&arg,"-rpc"), bVar18 ||
          (bVar18 = std::operator==(&arg,"--rpc"), bVar18)))) {
        if (argc <= iVar29 + 1) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&p);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->rpc_servers,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
        goto LAB_0012348b;
      }
      bVar18 = std::operator==(&arg,"-sm");
      if ((bVar18) || (bVar18 = std::operator==(&arg,"--split-mode"), bVar18)) {
        if (argc <= iVar29 + 1) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<std::__cxx11::string>(&p,(string *)&it,separator_04);
        std::__cxx11::string::~string((string *)&it);
        pbVar14 = p.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        it._M_position._M_pregex = (regex_type *)0x0;
        it._M_position._M_begin._M_current = (char *)0x0;
        it._M_position._M_end._M_current = (char *)0x0;
        for (__lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT71(p.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              p.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_1_); __lhs != pbVar14;
            __lhs = __lhs + 1) {
          bVar18 = std::operator==(__lhs,"none");
          if (bVar18) {
            regex._M_flags = 0;
          }
          else {
            bVar18 = std::operator==(__lhs,"layer");
            if (bVar18) {
              regex._M_flags = 1;
            }
            else {
              bVar18 = std::operator==(__lhs,"row");
              if (!bVar18) {
                bVar20 = true;
                goto LAB_00123d20;
              }
              regex._M_flags = 2;
            }
          }
          std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>::push_back
                    ((vector<llama_split_mode,_std::allocator<llama_split_mode>_> *)&it,
                     &regex._M_flags);
        }
        if (!bVar20) {
          std::vector<llama_split_mode,std::allocator<llama_split_mode>>::
          insert<__gnu_cxx::__normal_iterator<llama_split_mode*,std::vector<llama_split_mode,std::allocator<llama_split_mode>>>,void>
                    ((vector<llama_split_mode,std::allocator<llama_split_mode>> *)
                     &__return_storage_ptr__->split_mode,
                     (const_iterator)
                     (__return_storage_ptr__->split_mode).
                     super__Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>._M_impl
                     .super__Vector_impl_data._M_finish,
                     (__normal_iterator<llama_split_mode_*,_std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>_>
                      )it._M_position._M_begin._M_current,
                     (__normal_iterator<llama_split_mode_*,_std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>_>
                      )it._M_position._M_end._M_current);
          std::_Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>::~_Vector_base
                    ((_Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_> *)&it);
          goto LAB_00122b21;
        }
LAB_00123d20:
        std::_Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>::~_Vector_base
                  ((_Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_> *)&it);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&p);
        goto LAB_00123d3c;
      }
      bVar18 = std::operator==(&arg,"-mg");
      if ((bVar18) || (bVar18 = std::operator==(&arg,"--main-gpu"), bVar18)) {
        if (iVar29 + 1 < argc) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
          string_split<int>((vector<int,_std::allocator<int>_> *)&p,(string *)&it,delim_07);
          std::vector<int,_std::allocator<int>_>::_M_move_assign
                    (&__return_storage_ptr__->main_gpu,(_Vector_base<int,_std::allocator<int>_> *)&p
                    );
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&p);
          goto LAB_0012348b;
        }
        goto LAB_0012406f;
      }
      bVar18 = std::operator==(&arg,"-nkvo");
      if ((bVar18) || (bVar18 = std::operator==(&arg,"--no-kv-offload"), bVar18)) {
        if (argc <= iVar29 + 1) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<bool>((vector<bool,_std::allocator<bool>_> *)&it,(string *)&p,delim_08);
        std::__cxx11::string::~string((string *)&p);
        p_Var11 = &(__return_storage_ptr__->no_kv_offload).
                   super__Bvector_base<std::allocator<bool>_>._M_impl;
        uVar3 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
        uVar4 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
        __position_00.super__Bit_iterator_base._M_offset = uVar4;
        __position_00.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
        local_188 = it._M_position._M_pregex;
        mStack_180 = it._M_position._M_flags;
        __last_00.super__Bit_iterator_base._12_4_ = uStack_17c;
        __last_00.super__Bit_iterator_base._M_offset = it._M_position._M_flags;
        __last_00.super__Bit_iterator_base._M_p = (_Bit_type *)it._M_position._M_pregex;
        __first_09.super__Bit_iterator_base._8_8_ = 0;
        __first_09.super__Bit_iterator_base._M_p = (_Bit_type *)it._M_position._M_begin._M_current;
        __position_00.super__Bit_iterator_base._12_4_ = 0;
        std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                  ((vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->no_kv_offload,
                   __position_00,__first_09,__last_00);
LAB_00123177:
        iVar29 = iVar29 + 1;
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  ((_Bvector_base<std::allocator<bool>_> *)&it);
        goto LAB_00122bb0;
      }
      bVar18 = std::operator==(&arg,"--numa");
      if (bVar18) {
        iVar29 = iVar29 + 1;
        if (argc <= iVar29) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29],(allocator<char> *)&p);
        bVar18 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&it,"distribute");
        gVar26 = GGML_NUMA_STRATEGY_DISTRIBUTE;
        if (bVar18) {
LAB_001235e8:
          __return_storage_ptr__->numa = gVar26;
          bVar18 = true;
        }
        else {
          bVar18 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&it,"");
          gVar26 = GGML_NUMA_STRATEGY_DISTRIBUTE;
          if (bVar18) goto LAB_001235e8;
          bVar18 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&it,"isolate");
          gVar26 = GGML_NUMA_STRATEGY_ISOLATE;
          if (bVar18) goto LAB_001235e8;
          bVar18 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&it,"numactl");
          gVar26 = GGML_NUMA_STRATEGY_NUMACTL;
          if (bVar18) goto LAB_001235e8;
          bVar20 = true;
          bVar18 = false;
        }
        std::__cxx11::string::~string((string *)&it);
        if (bVar18) goto LAB_00122bb0;
        goto LAB_00123d3c;
      }
      bVar18 = std::operator==(&arg,"-fa");
      if ((bVar18) || (bVar18 = std::operator==(&arg,"--flash-attn"), bVar18)) {
        if (argc <= iVar29 + 1) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<bool>((vector<bool,_std::allocator<bool>_> *)&it,(string *)&p,delim_09);
        std::__cxx11::string::~string((string *)&p);
        p_Var11 = &(__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl;
        uVar5 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
        uVar6 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
        __position_01.super__Bit_iterator_base._M_offset = uVar6;
        __position_01.super__Bit_iterator_base._M_p = (_Bit_type *)uVar5;
        local_198 = it._M_position._M_pregex;
        mStack_190 = it._M_position._M_flags;
        __last_01.super__Bit_iterator_base._12_4_ = uStack_18c;
        __last_01.super__Bit_iterator_base._M_offset = it._M_position._M_flags;
        __last_01.super__Bit_iterator_base._M_p = (_Bit_type *)it._M_position._M_pregex;
        __first_10.super__Bit_iterator_base._8_8_ = 0;
        __first_10.super__Bit_iterator_base._M_p = (_Bit_type *)it._M_position._M_begin._M_current;
        __position_01.super__Bit_iterator_base._12_4_ = 0;
        std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                  ((vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->flash_attn,
                   __position_01,__first_10,__last_01);
        goto LAB_00123177;
      }
      bVar18 = std::operator==(&arg,"-mmp");
      if ((bVar18) || (bVar18 = std::operator==(&arg,"--mmap"), bVar18)) {
        if (argc <= iVar29 + 1) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<bool>((vector<bool,_std::allocator<bool>_> *)&it,(string *)&p,delim_10);
        std::__cxx11::string::~string((string *)&p);
        p_Var11 = &(__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl;
        uVar7 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
        uVar8 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
        __position_02.super__Bit_iterator_base._M_offset = uVar8;
        __position_02.super__Bit_iterator_base._M_p = (_Bit_type *)uVar7;
        local_1a8 = it._M_position._M_pregex;
        mStack_1a0 = it._M_position._M_flags;
        __last_02.super__Bit_iterator_base._12_4_ = uStack_19c;
        __last_02.super__Bit_iterator_base._M_offset = it._M_position._M_flags;
        __last_02.super__Bit_iterator_base._M_p = (_Bit_type *)it._M_position._M_pregex;
        __first_11.super__Bit_iterator_base._8_8_ = 0;
        __first_11.super__Bit_iterator_base._M_p = (_Bit_type *)it._M_position._M_begin._M_current;
        __position_02.super__Bit_iterator_base._12_4_ = 0;
        std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                  ((vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->use_mmap,
                   __position_02,__first_11,__last_02);
        goto LAB_00123177;
      }
      bVar18 = std::operator==(&arg,"-embd");
      if ((bVar18) || (bVar18 = std::operator==(&arg,"--embeddings"), bVar18)) {
        if (argc <= iVar29 + 1) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,argv[iVar29 + 1],(allocator<char> *)&regex);
        string_split<bool>((vector<bool,_std::allocator<bool>_> *)&it,(string *)&p,delim_11);
        std::__cxx11::string::~string((string *)&p);
        p_Var11 = &(__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl;
        uVar9 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
        uVar10 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
        __position_03.super__Bit_iterator_base._M_offset = uVar10;
        __position_03.super__Bit_iterator_base._M_p = (_Bit_type *)uVar9;
        local_1b8 = it._M_position._M_pregex;
        mStack_1b0 = it._M_position._M_flags;
        __last_03.super__Bit_iterator_base._12_4_ = uStack_1ac;
        __last_03.super__Bit_iterator_base._M_offset = it._M_position._M_flags;
        __last_03.super__Bit_iterator_base._M_p = (_Bit_type *)it._M_position._M_pregex;
        __first_12.super__Bit_iterator_base._8_8_ = 0;
        __first_12.super__Bit_iterator_base._M_p = (_Bit_type *)it._M_position._M_begin._M_current;
        __position_03.super__Bit_iterator_base._12_4_ = 0;
        std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                  ((vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->embeddings,
                   __position_03,__first_12,__last_03);
        goto LAB_00123177;
      }
      bVar18 = std::operator==(&arg,"-ts");
      if ((bVar18) || (bVar18 = std::operator==(&arg,"--tensor-split"), bVar18)) {
        if (iVar29 + 1 < argc) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&p);
          string_split<std::__cxx11::string>(&local_1d0,(string *)&it,separator_05);
          std::__cxx11::string::~string((string *)&it);
          pbVar14 = local_1d0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (local_2e0 = local_1d0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; local_2e0 != pbVar14;
              local_2e0 = local_2e0 + 1) {
            std::__cxx11::string::string((string *)&p,(string *)local_2e0);
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      (&regex,"[;/]+",0x10);
            __a._M_current._1_7_ =
                 p.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._1_7_;
            __a._M_current._0_1_ =
                 p.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_1_;
            std::__cxx11::
            regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::regex_token_iterator
                      (&it,__a,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(__a._M_current +
                                 (long)&(p.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus),
                       &regex,-1,0);
            std::__cxx11::
            regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::regex_token_iterator(&local_b8,&it);
            local_148._M_suffix.
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .second._M_current._0_1_ = 0;
            local_148._M_suffix._9_8_ = 0;
            local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_148._M_suffix.
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .first._M_current._0_1_ = 0;
            local_148._M_suffix.
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .first._M_current._1_7_ = 0;
            local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_148._M_position._M_match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_148._M_position._M_match._M_begin._M_current = (char *)0x0;
            local_148._M_position._M_match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_148._M_position._M_match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_148._M_position._M_pregex = (regex_type *)0x0;
            local_148._M_position._M_flags = 0;
            local_148._M_position._28_4_ = 0;
            local_148._M_position._M_begin._M_current = (char *)0x0;
            local_148._M_position._M_end._M_current = (char *)0x0;
            local_148._M_n = 0;
            local_148._M_result = (value_type *)0x0;
            local_148._M_has_m1 = false;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            vector<std::__cxx11::regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &split_arg,&local_b8,&local_148,(allocator_type *)&tensor_split);
            std::__cxx11::
            regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::~regex_token_iterator(&local_148);
            std::__cxx11::
            regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::~regex_token_iterator(&local_b8);
            pbVar16 = split_arg.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pbVar15 = split_arg.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar24 = llama_max_devices();
            if (uVar24 < (ulong)((long)pbVar16 - (long)pbVar15 >> 5)) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llama-bench/llama-bench.cpp"
                         ,0x224,"GGML_ASSERT(%s) failed","split_arg.size() <= llama_max_devices()");
            }
            __n = llama_max_devices();
            std::vector<float,_std::allocator<float>_>::vector(&tensor_split,__n,&local_389);
            local_3a0 = 0;
            for (uVar24 = 0; uVar25 = llama_max_devices(), uVar24 < uVar25; uVar24 = uVar24 + 1) {
              fVar30 = 0.0;
              if (uVar24 < (ulong)((long)split_arg.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)split_arg.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                fVar30 = std::__cxx11::stof((string *)
                                            ((long)&((split_arg.
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + local_3a0),(size_t *)0x0);
              }
              tensor_split.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar24] = fVar30;
              local_3a0 = local_3a0 + 0x20;
            }
            std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::push_back(&__return_storage_ptr__->tensor_split,&tensor_split);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&tensor_split.super__Vector_base<float,_std::allocator<float>_>);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&split_arg);
            std::__cxx11::
            regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::~regex_token_iterator(&it);
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&regex)
            ;
            std::__cxx11::string::~string((string *)&p);
          }
          this = &local_1d0;
          goto LAB_00122b26;
        }
        goto LAB_0012406f;
      }
      bVar18 = std::operator==(&arg,"-r");
      if ((bVar18) || (bVar18 = std::operator==(&arg,"--repetitions"), bVar18)) {
        if (argc <= iVar29 + 1) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&p);
        iVar21 = std::__cxx11::stoi((string *)&it,(size_t *)0x0,10);
        __return_storage_ptr__->reps = iVar21;
LAB_0012348b:
        iVar29 = iVar29 + 1;
        std::__cxx11::string::~string((string *)&it);
        goto LAB_00122bb0;
      }
      bVar18 = std::operator==(&arg,"--prio");
      if (bVar18) {
        if (argc <= iVar29 + 1) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&p);
        gVar22 = std::__cxx11::stoi((string *)&it,(size_t *)0x0,10);
        __return_storage_ptr__->prio = gVar22;
        goto LAB_0012348b;
      }
      bVar18 = std::operator==(&arg,"--delay");
      if (bVar18) {
        if (argc <= iVar29 + 1) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&p);
        iVar21 = std::__cxx11::stoi((string *)&it,(size_t *)0x0,10);
        __return_storage_ptr__->delay = iVar21;
        goto LAB_0012348b;
      }
      bVar18 = std::operator==(&arg,"-o");
      if ((bVar18) || (bVar18 = std::operator==(&arg,"--output"), bVar18)) {
        if (argc <= iVar29 + 1) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&p);
        format = &__return_storage_ptr__->output_format;
LAB_00123c88:
        bVar20 = output_format_from_str((string *)&it,format);
        bVar20 = !bVar20;
        goto LAB_0012348b;
      }
      bVar18 = std::operator==(&arg,"-oe");
      if ((bVar18) || (bVar18 = std::operator==(&arg,"--output-err"), bVar18)) {
        if (argc <= iVar29 + 1) goto LAB_0012406f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&p);
        format = &__return_storage_ptr__->output_format_stderr;
        goto LAB_00123c88;
      }
      bVar18 = std::operator==(&arg,"-v");
      if ((!bVar18) && (bVar18 = std::operator==(&arg,"--verbose"), !bVar18)) {
        bVar18 = std::operator==(&arg,"--progress");
        if (bVar18) {
          __return_storage_ptr__->progress = true;
          goto LAB_00122bb0;
        }
        goto LAB_0012406f;
      }
      __return_storage_ptr__->verbose = true;
      goto LAB_00122bb0;
    }
    if (argc <= iVar29 + 1) goto LAB_0012406f;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&it,argv[iVar29 + 1],(allocator<char> *)&regex);
    string_split<int>((vector<int,_std::allocator<int>_> *)&p,(string *)&it,delim_05);
    std::__cxx11::string::~string((string *)&it);
    __first_06._M_current._1_7_ =
         p.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._1_7_;
    __first_06._M_current._0_1_ =
         p.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._0_1_;
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->poll,
               (const_iterator)
               (__return_storage_ptr__->poll).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,__first_06,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               p.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
LAB_00122ba6:
  iVar29 = iVar29 + 1;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&p);
LAB_00122bb0:
  iVar29 = iVar29 + 1;
  goto LAB_00122a1d;
LAB_00123cf1:
  bVar20 = true;
LAB_00123cf4:
  std::_Vector_base<ggml_type,_std::allocator<ggml_type>_>::~_Vector_base
            ((_Vector_base<ggml_type,_std::allocator<ggml_type>_> *)&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&p);
  goto LAB_00123d3c;
}

Assistant:

static cmd_params parse_cmd_params(int argc, char ** argv) {
    cmd_params        params;
    std::string       arg;
    bool              invalid_param = false;
    const std::string arg_prefix    = "--";
    const char        split_delim   = ',';

    params.verbose              = cmd_params_defaults.verbose;
    params.output_format        = cmd_params_defaults.output_format;
    params.output_format_stderr = cmd_params_defaults.output_format_stderr;
    params.reps                 = cmd_params_defaults.reps;
    params.numa                 = cmd_params_defaults.numa;
    params.prio                 = cmd_params_defaults.prio;
    params.delay                = cmd_params_defaults.delay;
    params.progress             = cmd_params_defaults.progress;

    for (int i = 1; i < argc; i++) {
        arg = argv[i];
        if (arg.compare(0, arg_prefix.size(), arg_prefix) == 0) {
            std::replace(arg.begin(), arg.end(), '_', '-');
        }

        if (arg == "-h" || arg == "--help") {
            print_usage(argc, argv);
            exit(0);
        } else if (arg == "-m" || arg == "--model") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], split_delim);
            params.model.insert(params.model.end(), p.begin(), p.end());
        } else if (arg == "-p" || arg == "--n-prompt") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_prompt.insert(params.n_prompt.end(), p.begin(), p.end());
        } else if (arg == "-n" || arg == "--n-gen") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_gen.insert(params.n_gen.end(), p.begin(), p.end());
        } else if (arg == "-pg") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], ',');
            if (p.size() != 2) {
                invalid_param = true;
                break;
            }
            params.n_pg.push_back({ std::stoi(p[0]), std::stoi(p[1]) });
        } else if (arg == "-b" || arg == "--batch-size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_batch.insert(params.n_batch.end(), p.begin(), p.end());
        } else if (arg == "-ub" || arg == "--ubatch-size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_ubatch.insert(params.n_ubatch.end(), p.begin(), p.end());
        } else if (arg == "-ctk" || arg == "--cache-type-k") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                   p = string_split<std::string>(argv[i], split_delim);
            std::vector<ggml_type> types;
            for (const auto & t : p) {
                ggml_type gt = ggml_type_from_name(t);
                if (gt == GGML_TYPE_COUNT) {
                    invalid_param = true;
                    break;
                }
                types.push_back(gt);
            }
            if (invalid_param) {
                break;
            }
            params.type_k.insert(params.type_k.end(), types.begin(), types.end());
        } else if (arg == "-ctv" || arg == "--cache-type-v") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                   p = string_split<std::string>(argv[i], split_delim);
            std::vector<ggml_type> types;
            for (const auto & t : p) {
                ggml_type gt = ggml_type_from_name(t);
                if (gt == GGML_TYPE_COUNT) {
                    invalid_param = true;
                    break;
                }
                types.push_back(gt);
            }
            if (invalid_param) {
                break;
            }
            params.type_v.insert(params.type_v.end(), types.begin(), types.end());
        } else if (arg == "-t" || arg == "--threads") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_threads.insert(params.n_threads.end(), p.begin(), p.end());
        } else if (arg == "-C" || arg == "--cpu-mask") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], split_delim);
            params.cpu_mask.insert(params.cpu_mask.end(), p.begin(), p.end());
        } else if (arg == "--cpu-strict") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.cpu_strict.insert(params.cpu_strict.end(), p.begin(), p.end());
        } else if (arg == "--poll") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.poll.insert(params.poll.end(), p.begin(), p.end());
        } else if (arg == "-ngl" || arg == "--n-gpu-layers") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_gpu_layers.insert(params.n_gpu_layers.end(), p.begin(), p.end());
        } else if (llama_supports_rpc() && (arg == "-rpc" || arg == "--rpc")) {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.rpc_servers.push_back(argv[i]);
        } else if (arg == "-sm" || arg == "--split-mode") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                          p = string_split<std::string>(argv[i], split_delim);
            std::vector<llama_split_mode> modes;
            for (const auto & m : p) {
                llama_split_mode mode;
                if (m == "none") {
                    mode = LLAMA_SPLIT_MODE_NONE;
                } else if (m == "layer") {
                    mode = LLAMA_SPLIT_MODE_LAYER;
                } else if (m == "row") {
                    mode = LLAMA_SPLIT_MODE_ROW;
                } else {
                    invalid_param = true;
                    break;
                }
                modes.push_back(mode);
            }
            if (invalid_param) {
                break;
            }
            params.split_mode.insert(params.split_mode.end(), modes.begin(), modes.end());
        } else if (arg == "-mg" || arg == "--main-gpu") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.main_gpu = string_split<int>(argv[i], split_delim);
        } else if (arg == "-nkvo" || arg == "--no-kv-offload") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.no_kv_offload.insert(params.no_kv_offload.end(), p.begin(), p.end());
        } else if (arg == "--numa") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            } else {
                std::string value(argv[i]);
                /**/ if (value == "distribute" || value == "") {
                    params.numa = GGML_NUMA_STRATEGY_DISTRIBUTE;
                } else if (value == "isolate") {
                    params.numa = GGML_NUMA_STRATEGY_ISOLATE;
                } else if (value == "numactl") {
                    params.numa = GGML_NUMA_STRATEGY_NUMACTL;
                } else {
                    invalid_param = true;
                    break;
                }
            }
        } else if (arg == "-fa" || arg == "--flash-attn") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.flash_attn.insert(params.flash_attn.end(), p.begin(), p.end());
        } else if (arg == "-mmp" || arg == "--mmap") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.use_mmap.insert(params.use_mmap.end(), p.begin(), p.end());
        } else if (arg == "-embd" || arg == "--embeddings") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.embeddings.insert(params.embeddings.end(), p.begin(), p.end());
        } else if (arg == "-ts" || arg == "--tensor-split") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            for (auto ts : string_split<std::string>(argv[i], split_delim)) {
                // split string by ; and /
                const std::regex           regex{ R"([;/]+)" };
                std::sregex_token_iterator it{ ts.begin(), ts.end(), regex, -1 };
                std::vector<std::string>   split_arg{ it, {} };
                GGML_ASSERT(split_arg.size() <= llama_max_devices());

                std::vector<float> tensor_split(llama_max_devices());
                for (size_t i = 0; i < llama_max_devices(); ++i) {
                    if (i < split_arg.size()) {
                        tensor_split[i] = std::stof(split_arg[i]);
                    } else {
                        tensor_split[i] = 0.0f;
                    }
                }
                params.tensor_split.push_back(tensor_split);
            }
        } else if (arg == "-r" || arg == "--repetitions") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.reps = std::stoi(argv[i]);
        } else if (arg == "--prio") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.prio = (enum ggml_sched_priority) std::stoi(argv[i]);
        } else if (arg == "--delay") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.delay = std::stoi(argv[i]);
        } else if (arg == "-o" || arg == "--output") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            invalid_param = !output_format_from_str(argv[i], params.output_format);
        } else if (arg == "-oe" || arg == "--output-err") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            invalid_param = !output_format_from_str(argv[i], params.output_format_stderr);
        } else if (arg == "-v" || arg == "--verbose") {
            params.verbose = true;
        } else if (arg == "--progress") {
            params.progress = true;
        } else {
            invalid_param = true;
            break;
        }
    }
    if (invalid_param) {
        fprintf(stderr, "error: invalid parameter for argument: %s\n", arg.c_str());
        print_usage(argc, argv);
        exit(1);
    }

    // set defaults
    if (params.model.empty()) {
        params.model = cmd_params_defaults.model;
    }
    if (params.n_prompt.empty()) {
        params.n_prompt = cmd_params_defaults.n_prompt;
    }
    if (params.n_gen.empty()) {
        params.n_gen = cmd_params_defaults.n_gen;
    }
    if (params.n_pg.empty()) {
        params.n_pg = cmd_params_defaults.n_pg;
    }
    if (params.n_batch.empty()) {
        params.n_batch = cmd_params_defaults.n_batch;
    }
    if (params.n_ubatch.empty()) {
        params.n_ubatch = cmd_params_defaults.n_ubatch;
    }
    if (params.type_k.empty()) {
        params.type_k = cmd_params_defaults.type_k;
    }
    if (params.type_v.empty()) {
        params.type_v = cmd_params_defaults.type_v;
    }
    if (params.n_gpu_layers.empty()) {
        params.n_gpu_layers = cmd_params_defaults.n_gpu_layers;
    }
    if (params.rpc_servers.empty()) {
        params.rpc_servers = cmd_params_defaults.rpc_servers;
    }
    if (params.split_mode.empty()) {
        params.split_mode = cmd_params_defaults.split_mode;
    }
    if (params.main_gpu.empty()) {
        params.main_gpu = cmd_params_defaults.main_gpu;
    }
    if (params.no_kv_offload.empty()) {
        params.no_kv_offload = cmd_params_defaults.no_kv_offload;
    }
    if (params.flash_attn.empty()) {
        params.flash_attn = cmd_params_defaults.flash_attn;
    }
    if (params.tensor_split.empty()) {
        params.tensor_split = cmd_params_defaults.tensor_split;
    }
    if (params.use_mmap.empty()) {
        params.use_mmap = cmd_params_defaults.use_mmap;
    }
    if (params.embeddings.empty()) {
        params.embeddings = cmd_params_defaults.embeddings;
    }
    if (params.n_threads.empty()) {
        params.n_threads = cmd_params_defaults.n_threads;
    }
    if (params.cpu_mask.empty()) {
        params.cpu_mask = cmd_params_defaults.cpu_mask;
    }
    if (params.cpu_strict.empty()) {
        params.cpu_strict = cmd_params_defaults.cpu_strict;
    }
    if (params.poll.empty()) {
        params.poll = cmd_params_defaults.poll;
    }

    return params;
}